

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeMerging.cpp
# Opt level: O2

HeapType __thiscall wasm::anon_unknown_0::TypeMerging::getMerged(TypeMerging *this,HeapType type)

{
  iterator iVar1;
  key_type local_20;
  HeapType type_local;
  
  local_20.id = type.id;
  while( true ) {
    iVar1 = std::
            _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::HeapType>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&(this->merges)._M_h,&local_20);
    if (iVar1.super__Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::HeapType>,_true>.
        _M_cur == (__node_type *)0x0) break;
    local_20.id = *(uintptr_t *)
                   ((long)iVar1.
                          super__Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::HeapType>,_true>
                          ._M_cur + 0x10);
  }
  return (HeapType)local_20.id;
}

Assistant:

HeapType getMerged(HeapType type) {
    for (auto it = merges.find(type); it != merges.end();
         it = merges.find(type)) {
      type = it->second;
    }
    return type;
  }